

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

IEEEFloat * __thiscall llvm::detail::IEEEFloat::operator=(IEEEFloat *this,IEEEFloat *rhs)

{
  fltSemantics *pfVar1;
  integerPart *piVar2;
  uint uVar3;
  
  if (this != rhs) {
    pfVar1 = rhs->semantics;
    if (this->semantics != pfVar1) {
      if ((this->semantics->precision - 0x40 < 0xffffff80) &&
         ((this->significand).parts != (integerPart *)0x0)) {
        operator_delete__((this->significand).parts);
        pfVar1 = rhs->semantics;
      }
      this->semantics = pfVar1;
      uVar3 = pfVar1->precision + 0x40;
      if (0x7f < uVar3) {
        piVar2 = (integerPart *)operator_new__((ulong)(uVar3 >> 3 & 0xfffffff8));
        (this->significand).parts = piVar2;
      }
    }
    assign(this,rhs);
  }
  return this;
}

Assistant:

IEEEFloat &IEEEFloat::operator=(const IEEEFloat &rhs) {
  if (this != &rhs) {
    if (semantics != rhs.semantics) {
      freeSignificand();
      initialize(rhs.semantics);
    }
    assign(rhs);
  }

  return *this;
}